

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManResolve(Cbs2_Man_t *p,int Level,int hClause0,int hClause1)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  piVar4 = (p->pClauses).pData;
  lVar10 = (long)Level;
  if (piVar4[lVar10 + 1] == 0) {
    __assert_fail("pQue->pData[hClause0+1] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x39d,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  lVar7 = (long)hClause0;
  if (piVar4[lVar10 + 1] != piVar4[lVar7 + 1]) {
    __assert_fail("pQue->pData[hClause0+1] == pQue->pData[hClause1+1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x39e,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  iVar3 = (p->pClauses).iHead;
  if (iVar3 != (p->pClauses).iTail) {
    __assert_fail("Cbs2_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x3a3,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  if (iVar3 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar3 * 2;
    piVar4 = (int *)realloc(piVar4,(long)iVar3 << 3);
    iVar3 = (p->pClauses).iTail;
    (p->pClauses).pData = piVar4;
  }
  (p->pClauses).iTail = iVar3 + 1;
  piVar4[iVar3] = 0;
  iVar3 = (p->pClauses).iTail;
  if (iVar3 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar3 * 2;
    piVar5 = (int *)realloc(piVar4,(long)iVar3 << 3);
    iVar3 = (p->pClauses).iTail;
    (p->pClauses).pData = piVar5;
    piVar4 = piVar5;
  }
  else {
    piVar5 = (p->pClauses).pData;
  }
  (p->pClauses).iTail = iVar3 + 1;
  piVar4[iVar3] = 0;
  iVar3 = -1;
  if (1 < piVar5[lVar10]) {
    lVar6 = 1;
    do {
      uVar1 = piVar5[lVar10 + lVar6 + 1];
      uVar8 = (ulong)uVar1;
      if (uVar8 == 0) break;
      if (((int)uVar1 < 0) || ((p->vMark).nSize <= (int)uVar1)) goto LAB_00726a6f;
      pcVar2 = (p->vMark).pArray;
      if (pcVar2[uVar8] == '\0') {
        pcVar2[uVar8] = '\x01';
        iVar9 = (p->pClauses).iTail;
        if (iVar9 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar9 * 2;
          piVar4 = (p->pClauses).pData;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar9 << 3);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar9 << 3);
            iVar9 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = piVar4;
        }
        else {
          piVar4 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar9 + 1;
        piVar4[iVar9] = uVar1;
        if ((p->vLevReason).nSize <= (int)(uVar1 * 3)) goto LAB_00726a8e;
        iVar9 = (p->vLevReason).pArray[uVar8 * 3];
        if (iVar9 == -1) goto LAB_00726aad;
        if (iVar3 <= iVar9) {
          iVar3 = iVar9;
        }
      }
      piVar5 = (p->pClauses).pData;
      lVar6 = lVar6 + 1;
    } while (lVar6 < piVar5[lVar10]);
  }
  piVar4 = (p->pClauses).pData;
  if (1 < piVar4[lVar7]) {
    lVar10 = 1;
    do {
      uVar1 = piVar4[lVar7 + lVar10 + 1];
      uVar8 = (ulong)uVar1;
      if (uVar8 == 0) break;
      if (((int)uVar1 < 0) || ((p->vMark).nSize <= (int)uVar1)) {
LAB_00726a6f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      pcVar2 = (p->vMark).pArray;
      if (pcVar2[uVar8] == '\0') {
        pcVar2[uVar8] = '\x01';
        iVar9 = (p->pClauses).iTail;
        if (iVar9 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar9 * 2;
          piVar4 = (p->pClauses).pData;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar9 << 3);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar9 << 3);
            iVar9 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = piVar4;
        }
        else {
          piVar4 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar9 + 1;
        piVar4[iVar9] = uVar1;
        if ((p->vLevReason).nSize <= (int)(uVar1 * 3)) {
LAB_00726a8e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = (p->vLevReason).pArray[uVar8 * 3];
        if (iVar9 == -1) {
LAB_00726aad:
          __assert_fail("!Cbs2_VarUnused(p, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x8f,"int Cbs2_VarDecLevel(Cbs2_Man_t *, int)");
        }
        if (iVar3 <= iVar9) {
          iVar3 = iVar9;
        }
        piVar4 = (p->pClauses).pData;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < piVar4[lVar7]);
  }
  iVar9 = (p->pClauses).iHead;
  if (iVar9 + 2 < (p->pClauses).iTail) {
    lVar10 = (long)iVar9 + 2;
    do {
      iVar9 = (p->pClauses).pData[lVar10];
      if (((long)iVar9 < 0) || ((p->vMark).nSize <= iVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      (p->vMark).pArray[iVar9] = '\0';
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->pClauses).iTail);
  }
  iVar3 = Cbs2_ManDeriveReason(p,iVar3);
  return iVar3;
}

Assistant:

static inline int Cbs2_ManResolve( Cbs2_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, iObj, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0+1] != 0 );
    assert( pQue->pData[hClause0+1] == pQue->pData[hClause1+1] );
    //Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    //Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
//    for ( i = hClause0 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
//    for ( i = hClause1 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
        Cbs2_VarSetMark0(p, pQue->pData[i], 0);
    return Cbs2_ManDeriveReason( p, LevelMax );
}